

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::subcase_start
          (ConsoleReporter *this,SubcaseSignature *subc)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  SubcaseSignature *subc_local;
  ConsoleReporter *this_local;
  
  lock._M_device = (mutex_type *)subc;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::push_back
            (&this->subcasesStack,(value_type *)lock._M_device);
  this->currentSubcaseLevel = this->currentSubcaseLevel + 1;
  this->hasLoggedCurrentTestStart = false;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void subcase_start(const SubcaseSignature& subc) override {
            std::lock_guard<std::mutex> lock(mutex);
            subcasesStack.push_back(subc);
            ++currentSubcaseLevel;
            hasLoggedCurrentTestStart = false;
        }